

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O0

char * check_parameter(problem *prob,parameter *param)

{
  parameter *param_local;
  problem *prob_local;
  
  if (0.0 < param->eps) {
    if (0.0 < param->C) {
      if (0.0 < param->p || param->p == 0.0) {
        if (((((((param->solver_type == 0) || (param->solver_type == 1)) ||
               (param->solver_type == 2)) ||
              ((param->solver_type == 3 || (param->solver_type == 4)))) ||
             ((param->solver_type == 5 || ((param->solver_type == 6 || (param->solver_type == 7)))))
             ) || (param->solver_type == 0xb)) ||
           ((param->solver_type == 0xc || (param->solver_type == 0xd)))) {
          if ((param->init_sol == (double *)0x0) ||
             ((param->solver_type == 0 || (param->solver_type == 2)))) {
            prob_local = (problem *)0x0;
          }
          else {
            prob_local = (problem *)anon_var_dwarf_394;
          }
        }
        else {
          prob_local = (problem *)anon_var_dwarf_37d;
        }
      }
      else {
        prob_local = (problem *)anon_var_dwarf_372;
      }
    }
    else {
      prob_local = (problem *)anon_var_dwarf_367;
    }
  }
  else {
    prob_local = (problem *)anon_var_dwarf_35c;
  }
  return (char *)prob_local;
}

Assistant:

const char *check_parameter(const problem *prob, const parameter *param)
{
	if(param->eps <= 0)
		return "eps <= 0";

	if(param->C <= 0)
		return "C <= 0";

	if(param->p < 0)
		return "p < 0";

	if(param->solver_type != L2R_LR
		&& param->solver_type != L2R_L2LOSS_SVC_DUAL
		&& param->solver_type != L2R_L2LOSS_SVC
		&& param->solver_type != L2R_L1LOSS_SVC_DUAL
		&& param->solver_type != MCSVM_CS
		&& param->solver_type != L1R_L2LOSS_SVC
		&& param->solver_type != L1R_LR
		&& param->solver_type != L2R_LR_DUAL
		&& param->solver_type != L2R_L2LOSS_SVR
		&& param->solver_type != L2R_L2LOSS_SVR_DUAL
		&& param->solver_type != L2R_L1LOSS_SVR_DUAL)
		return "unknown solver type";

	if(param->init_sol != NULL 
		&& param->solver_type != L2R_LR && param->solver_type != L2R_L2LOSS_SVC)
		return "Initial-solution specification supported only for solver L2R_LR and L2R_L2LOSS_SVC";

	return NULL;
}